

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::TestsessionFixtureSessionDoesNotResetOnLogon::RunImpl
          (TestsessionFixtureSessionDoesNotResetOnLogon *this)

{
  AssertException *e;
  MemoryOutStream stream;
  exception *e_1;
  undefined1 local_648 [8];
  sessionFixtureSessionDoesNotResetOnLogonHelper fixtureHelper;
  bool ctorOk;
  TestsessionFixtureSessionDoesNotResetOnLogon *this_local;
  
  fixtureHelper.m_details._7_1_ = 0;
  sessionFixtureSessionDoesNotResetOnLogonHelper::sessionFixtureSessionDoesNotResetOnLogonHelper
            ((sessionFixtureSessionDoesNotResetOnLogonHelper *)local_648,
             &(this->super_Test).m_details);
  fixtureHelper.m_details._7_1_ = 1;
  UnitTest::ExecuteTest<SuiteSessionTests::sessionFixtureSessionDoesNotResetOnLogonHelper>
            ((sessionFixtureSessionDoesNotResetOnLogonHelper *)local_648,
             &(this->super_Test).m_details);
  sessionFixtureSessionDoesNotResetOnLogonHelper::~sessionFixtureSessionDoesNotResetOnLogonHelper
            ((sessionFixtureSessionDoesNotResetOnLogonHelper *)local_648);
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, SessionDoesNotResetOnLogon) {
  createSession(1);
  object->setResetOnLogon(false);
  CHECK(!object->getResetOnLogon());
}